

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void show_temp_role(CHAR_DATA *ch)

{
  BUFFER *buffer;
  CHAR_DATA *in_RDI;
  char *unaff_retaddr;
  BUFFER *output;
  CHAR_DATA *in_stack_ffffffffffffffe8;
  
  send_to_char(unaff_retaddr,in_RDI);
  if ((in_RDI->pcdata->temp_role == (char *)0x0) || (*in_RDI->pcdata->temp_role == '\0')) {
    send_to_char(unaff_retaddr,in_RDI);
  }
  else {
    buffer = new_buf();
    add_buf(output,unaff_retaddr);
    buf_string(buffer);
    page_to_char((char *)buffer,in_stack_ffffffffffffffe8);
    free_buf((BUFFER *)0x557906);
  }
  return;
}

Assistant:

void show_temp_role(CHAR_DATA *ch)
{
	send_to_char("Role entry in progress:\n\r", ch);

	if (ch->pcdata->temp_role == nullptr || ch->pcdata->temp_role[0] == '\0')
	{
		send_to_char("You have no role in progress.\n\r", ch);
	}
	else
	{
		auto output = new_buf();
		add_buf(output, ch->pcdata->temp_role);
		page_to_char(buf_string(output), ch);
		free_buf(output);
	}
}